

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O1

void __thiscall gl3cts::TransformFeedback::QueryGeometrySeparate::draw(QueryGeometrySeparate *this)

{
  GLuint in_ESI;
  
  draw((QueryGeometrySeparate *)
       ((long)&(this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.
               _vptr_CaptureGeometryInterleaved +
       (long)(this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.
             _vptr_CaptureGeometryInterleaved[-10]),in_ESI);
  return;
}

Assistant:

void gl3cts::TransformFeedback::QueryGeometrySeparate::draw(glw::GLuint primitive_case)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.beginQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN, m_query_object);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginQuery call failed.");

	gl3cts::TransformFeedback::CaptureGeometrySeparate::draw(primitive_case);

	gl.endQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndQuery call failed.");
}